

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O2

string * __thiscall
miniros::Subscription::datatype_abi_cxx11_(string *__return_storage_ptr__,Subscription *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->datatype_);
  return __return_storage_ptr__;
}

Assistant:

const std::string Subscription::datatype()
{
  return datatype_;
}